

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerService.cpp
# Opt level: O0

sockaddr_in __thiscall ServerService::initBroadcast(ServerService *this,int port)

{
  sockaddr_in sVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 local_28;
  int ret;
  int opt;
  int port_local;
  ServerService *this_local;
  sockaddr_in peerAddr;
  
  local_28 = 1;
  ret = port;
  _opt = this;
  memset(&this_local,0,0x10);
  this_local._0_2_ = 2;
  this_local._2_2_ = htons((uint16_t)ret);
  this_local._4_4_ = htonl(0xffffffff);
  iVar2 = socket(2,2,0);
  this->broadcastFD = iVar2;
  if (this->broadcastFD == -1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Create Broadcast Socket Fail");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  iVar2 = setsockopt(this->broadcastFD,1,6,&local_28,4);
  if (iVar2 == -1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Set Socket To Broadcast Format Fail");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    exit(2);
  }
  sVar1.sin_port = this_local._2_2_;
  sVar1.sin_family = this_local._0_2_;
  sVar1.sin_addr.s_addr = this_local._4_4_;
  sVar1.sin_zero = (uchar  [8])peerAddr._0_8_;
  return sVar1;
}

Assistant:

struct sockaddr_in ServerService::initBroadcast(int port) {
    struct sockaddr_in peerAddr;
    const int opt = 1;
    int ret = 0;

    bzero(&peerAddr, sizeof(struct sockaddr_in));
    peerAddr.sin_family = AF_INET;
    peerAddr.sin_port = htons(port);
    peerAddr.sin_addr.s_addr = htonl(INADDR_BROADCAST);

    broadcastFD = socket(AF_INET, SOCK_DGRAM, 0);
    if (broadcastFD == -1) {
        cout << "Create Broadcast Socket Fail" << endl;
        exit(1);
    }

    ret = setsockopt(broadcastFD, SOL_SOCKET, SO_BROADCAST, (char *)&opt, sizeof(opt));
    if (ret == -1) {
        cout << "Set Socket To Broadcast Format Fail" << endl;
        exit(2);
    }
    return peerAddr;
}